

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopDfs.c
# Opt level: O2

Hop_Obj_t * Hop_Remap(Hop_Man_t *p,Hop_Obj_t *pRoot,uint uSupp,int nVars)

{
  int iVar1;
  undefined8 *puVar2;
  Hop_Obj_t *pHVar3;
  uint uVar4;
  Hop_Obj_t *pObj;
  
  if (p->nObjs[2] < nVars) {
    pRoot = (Hop_Obj_t *)0x0;
    printf("Hop_Remap(): The number of variables (%d) is more than the manager size (%d).\n",
           (ulong)(uint)nVars);
  }
  else {
    pObj = (Hop_Obj_t *)((ulong)pRoot & 0xfffffffffffffffe);
    iVar1 = Hop_ObjIsConst1(pObj);
    if (iVar1 == 0) {
      if (uSupp == 0) {
        if (((ulong)pRoot & 1) == 0) {
          uVar4 = *(uint *)&pRoot->field_0x20 >> 3 & 1;
        }
        else {
          uVar4 = (uint)((pObj->field_0x20 & 8) == 0);
        }
        pRoot = (Hop_Obj_t *)((ulong)p->pConst1 ^ (ulong)uVar4 ^ 1);
      }
      else {
        iVar1 = 0;
        for (uVar4 = 0; (int)uVar4 < p->vPis->nSize; uVar4 = uVar4 + 1) {
          puVar2 = (undefined8 *)Vec_PtrEntry(p->vPis,uVar4);
          if (nVars == uVar4) break;
          if ((uSupp >> (uVar4 & 0x1f) & 1) == 0) {
            pHVar3 = (Hop_Obj_t *)((ulong)p->pConst1 ^ 1);
          }
          else {
            pHVar3 = Hop_IthVar(p,iVar1);
            iVar1 = iVar1 + 1;
          }
          *puVar2 = pHVar3;
        }
        if ((iVar1 < 1) || (nVars <= iVar1)) {
          __assert_fail("k > 0 && k < nVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopDfs.c"
                        ,0x220,"Hop_Obj_t *Hop_Remap(Hop_Man_t *, Hop_Obj_t *, unsigned int, int)");
        }
        Hop_Remap_rec(p,pObj);
        Hop_ConeUnmark_rec(pObj);
        pRoot = (Hop_Obj_t *)((ulong)((uint)pRoot & 1) ^ (ulong)(pObj->field_0).pData);
      }
    }
  }
  return pRoot;
}

Assistant:

Hop_Obj_t * Hop_Remap( Hop_Man_t * p, Hop_Obj_t * pRoot, unsigned uSupp, int nVars )
{
    Hop_Obj_t * pObj;
    int i, k;
    // quit if the PI variable is not defined
    if ( nVars > Hop_ManPiNum(p) )
    {
        printf( "Hop_Remap(): The number of variables (%d) is more than the manager size (%d).\n", nVars, Hop_ManPiNum(p) );
        return NULL;
    }
    // return if constant
    if ( Hop_ObjIsConst1( Hop_Regular(pRoot) ) )
        return pRoot;
    if ( uSupp == 0 )
        return Hop_NotCond( Hop_ManConst0(p), Hop_ObjPhaseCompl(pRoot) );
    // set the PI mapping
    k = 0;
    Hop_ManForEachPi( p, pObj, i )
    {
        if ( i == nVars )
           break;
        if ( uSupp & (1 << i) )
            pObj->pData = Hop_IthVar(p, k++);
        else
            pObj->pData = Hop_ManConst0(p);
    }
    assert( k > 0 && k < nVars );
    // recursively perform composition
    Hop_Remap_rec( p, Hop_Regular(pRoot) );
    // clear the markings
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    return Hop_NotCond( (Hop_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}